

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O0

void anon_unknown.dwarf_e6ba5::destroyStaleFBOs(void)

{
  bool bVar1;
  pointer ppVar2;
  _Self __position;
  uint local_24;
  iterator iStack_20;
  GLuint frameBuffer;
  _Self local_18;
  iterator iter;
  Uint64 contextId;
  
  iter._M_node = (_Base_ptr)sf::Context::getActiveContextId();
  local_18._M_node =
       (_Base_ptr)
       std::
       set<std::pair<unsigned_long_long,_unsigned_int>,_std::less<std::pair<unsigned_long_long,_unsigned_int>_>,_std::allocator<std::pair<unsigned_long_long,_unsigned_int>_>_>
       ::begin((set<std::pair<unsigned_long_long,_unsigned_int>,_std::less<std::pair<unsigned_long_long,_unsigned_int>_>,_std::allocator<std::pair<unsigned_long_long,_unsigned_int>_>_>
                *)(anonymous_namespace)::staleFrameBuffers);
  while( true ) {
    iStack_20 = std::
                set<std::pair<unsigned_long_long,_unsigned_int>,_std::less<std::pair<unsigned_long_long,_unsigned_int>_>,_std::allocator<std::pair<unsigned_long_long,_unsigned_int>_>_>
                ::end((set<std::pair<unsigned_long_long,_unsigned_int>,_std::less<std::pair<unsigned_long_long,_unsigned_int>_>,_std::allocator<std::pair<unsigned_long_long,_unsigned_int>_>_>
                       *)(anonymous_namespace)::staleFrameBuffers);
    bVar1 = std::operator!=(&local_18,&stack0xffffffffffffffe0);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<unsigned_long_long,_unsigned_int>_>::operator->
                       (&local_18);
    if ((_Base_ptr)ppVar2->first == iter._M_node) {
      ppVar2 = std::_Rb_tree_const_iterator<std::pair<unsigned_long_long,_unsigned_int>_>::
               operator->(&local_18);
      local_24 = ppVar2->second;
      (*sf_ptrc_glDeleteFramebuffersEXT)(1,&local_24);
      sf::priv::glCheckError
                ("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                 ,0x44,"GLEXT_glDeleteFramebuffers(1, &frameBuffer)");
      __position = std::_Rb_tree_const_iterator<std::pair<unsigned_long_long,_unsigned_int>_>::
                   operator++(&local_18,0);
      std::
      set<std::pair<unsigned_long_long,unsigned_int>,std::less<std::pair<unsigned_long_long,unsigned_int>>,std::allocator<std::pair<unsigned_long_long,unsigned_int>>>
      ::erase_abi_cxx11_((set<std::pair<unsigned_long_long,unsigned_int>,std::less<std::pair<unsigned_long_long,unsigned_int>>,std::allocator<std::pair<unsigned_long_long,unsigned_int>>>
                          *)(anonymous_namespace)::staleFrameBuffers,
                         (const_iterator)__position._M_node);
    }
    else {
      std::_Rb_tree_const_iterator<std::pair<unsigned_long_long,_unsigned_int>_>::operator++
                (&local_18);
    }
  }
  return;
}

Assistant:

void destroyStaleFBOs()
    {
        sf::Uint64 contextId = sf::Context::getActiveContextId();

        for (std::set<std::pair<sf::Uint64, unsigned int> >::iterator iter = staleFrameBuffers.begin(); iter != staleFrameBuffers.end();)
        {
            if (iter->first == contextId)
            {
                GLuint frameBuffer = static_cast<GLuint>(iter->second);
                glCheck(GLEXT_glDeleteFramebuffers(1, &frameBuffer));

                staleFrameBuffers.erase(iter++);
            }
            else
            {
                ++iter;
            }
        }
    }